

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::SampleList::SampleList(SampleList *this)

{
  SampleList *this_local;
  
  Item::Item(&this->super_Item,TYPE_SAMPLELIST);
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__SampleList_00141bc0;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->description);
  SampleInfo::SampleInfo(&this->sampleInfo);
  List::List(&this->samples);
  return;
}

Assistant:

SampleList		(void) : Item(TYPE_SAMPLELIST) {}